

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords(Dictionary *this,string *word)

{
  bool bVar1;
  int32_t iVar2;
  string *in_RSI;
  Dictionary *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  vector<int,_std::allocator<int>_> *in_stack_00000020;
  string *in_stack_00000028;
  Dictionary *in_stack_00000030;
  int32_t i;
  vector<int,_std::allocator<int>_> *ngrams;
  Dictionary *this_00;
  Dictionary *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_40 [8];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  iVar2 = getId(in_stack_ffffffffffffff90,in_RSI);
  if (iVar2 < 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1728c1);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_RDI);
    if (bVar1) {
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::operator+(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00);
      computeSubwords(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    }
  }
  else {
    getSubwords(this_00,(int32_t)((ulong)in_RDI >> 0x20));
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return (vector<int,_std::allocator<int>_> *)this_00;
}

Assistant:

const std::vector<int32_t> Dictionary::getSubwords(
    const std::string& word) const {
  int32_t i = getId(word);
  if (i >= 0) {
    return getSubwords(i);
  }
  std::vector<int32_t> ngrams;
  if (word != EOS) {
    computeSubwords(BOW + word + EOW, ngrams);
  }
  return ngrams;
}